

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::bt_peer_connection::write_piece
          (bt_peer_connection *this,peer_request *r,disk_buffer_holder *buffer)

{
  size_t this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  element_type *peVar6;
  torrent_info *ptVar7;
  size_type __n;
  reference pvVar8;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar9;
  size_type sVar10;
  counters *this_01;
  alert_manager *paVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_1e4;
  undefined1 local_1e0 [56];
  disk_buffer_holder local_1a8;
  span<const_char> local_188;
  span<const_char> local_178;
  span<const_char> local_168;
  char **local_158;
  char *ptr2;
  string local_148;
  data_type local_124;
  reference local_120;
  pair<const_int,_libtorrent::digest32<160L>_> *i;
  iterator __end2;
  iterator __begin2;
  map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  *__range2;
  undefined1 local_f8 [8];
  map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  merkle_node_list;
  list_type *l;
  entry piece_list;
  vector<char,_std::allocator<char>_> piece_list_buf;
  char *ptr;
  char msg [17];
  undefined1 local_40 [7];
  bool merkle;
  undefined1 local_30 [8];
  shared_ptr<libtorrent::torrent> t;
  disk_buffer_holder *buffer_local;
  peer_request *r_local;
  bt_peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buffer;
  peer_connection::associated_torrent((peer_connection *)local_40);
  std::weak_ptr<libtorrent::torrent>::lock((weak_ptr<libtorrent::torrent> *)local_30);
  std::weak_ptr<libtorrent::torrent>::~weak_ptr((weak_ptr<libtorrent::torrent> *)local_40);
  peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  ptVar7 = torrent::torrent_file(peVar6);
  bVar1 = libtorrent::torrent_info::is_merkle_torrent(ptVar7);
  bVar2 = false;
  if (bVar1) {
    bVar2 = r->start == 0;
  }
  piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = &ptr;
  detail::write_int32<int,char*>
            (r->length + 9,
             (char **)&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       field_0x10);
  bVar1 = libtorrent::aux::session_settings::get_bool
                    ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                     0x8036);
  if ((bVar1) && (bVar2)) {
    detail::write_uint8<int,char*>
              (0xfa,(char **)&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .field_0x10);
  }
  else {
    detail::write_uint8<libtorrent::bt_peer_connection::message_type,char*>
              (msg_piece,
               (char **)&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10);
  }
  iVar3 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)r);
  detail::write_int32<int,char*>
            (iVar3,(char **)&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
  detail::write_int32<int,char*>
            (r->start,(char **)&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.field_0x10);
  if (bVar2) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&piece_list.field_0x30);
    entry::entry((entry *)&l);
    merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)entry::list((entry *)&l);
    peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    ptVar7 = torrent::torrent_file(peVar6);
    libtorrent::torrent_info::build_merkle_list
              ((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
                *)local_f8,ptVar7,(piece_index_t)(r->piece).m_val);
    this_00 = merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __n = std::
          map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
          ::size((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
                  *)local_f8);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)this_00,__n);
    __end2 = std::
             map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
             ::begin((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
                      *)local_f8);
    i = (pair<const_int,_libtorrent::digest32<160L>_> *)
        std::
        map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
        ::end((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
               *)local_f8);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&i), bVar2) {
      local_120 = std::_Rb_tree_iterator<std::pair<const_int,_libtorrent::digest32<160L>_>_>::
                  operator*(&__end2);
      local_124 = list_t;
      std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
      emplace_back<libtorrent::entry::data_type>
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                 merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_124);
      pvVar8 = std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::back
                         ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                          merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pvVar9 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(pvVar8);
      std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::emplace_back<int_const&>
                (pvVar9,&local_120->first);
      pvVar8 = std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::back
                         ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                          merkle_node_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pvVar9 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(pvVar8);
      digest32<160l>::to_string_abi_cxx11_(&local_148,&local_120->second);
      std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string>(pvVar9,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::_Rb_tree_iterator<std::pair<const_int,_libtorrent::digest32<160L>_>_>::operator++
                (&__end2);
    }
    ptr2 = (char *)std::back_inserter<std::vector<char,std::allocator<char>>>
                             ((vector<char,_std::allocator<char>_> *)&piece_list.field_0x30);
    bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)ptr2,(entry *)&l);
    sVar10 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)&piece_list.field_0x30);
    detail::write_int32<int,char*>
              ((int)sVar10,
               (char **)&piece_list_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10);
    local_158 = &ptr;
    iVar3 = r->length;
    sVar10 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)&piece_list.field_0x30);
    detail::write_int32<int,char*>(iVar3 + 0xd + (int)sVar10,(char **)&local_158);
    span<const_char>::span(&local_168,(char *)&ptr,0x11);
    peer_connection::send_buffer(&this->super_peer_connection,local_168);
    span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
              ((span<char_const> *)&local_178,
               (vector<char,_std::allocator<char>_> *)&piece_list.field_0x30);
    peer_connection::send_buffer(&this->super_peer_connection,local_178);
    std::
    map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
    ::~map((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
            *)local_f8);
    entry::~entry((entry *)&l);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&piece_list.field_0x30);
  }
  else {
    span<const_char>::span(&local_188,(char *)&ptr,0xd);
    peer_connection::send_buffer(&this->super_peer_connection,local_188);
  }
  bVar2 = disk_buffer_holder::is_mutable(buffer);
  if (bVar2) {
    disk_buffer_holder::disk_buffer_holder(&local_1a8,buffer);
    peer_connection::append_send_buffer<libtorrent::disk_buffer_holder>
              (&this->super_peer_connection,&local_1a8,r->length);
    disk_buffer_holder::~disk_buffer_holder(&local_1a8);
  }
  else {
    disk_buffer_holder::disk_buffer_holder((disk_buffer_holder *)(local_1e0 + 0x18),buffer);
    append_const_send_buffer<libtorrent::disk_buffer_holder>
              (this,(disk_buffer_holder *)(local_1e0 + 0x18),r->length);
    disk_buffer_holder::~disk_buffer_holder((disk_buffer_holder *)(local_1e0 + 0x18));
  }
  local_1e0._20_4_ = peer_connection::send_buffer_size(&this->super_peer_connection);
  local_1e0._20_4_ = local_1e0._20_4_ - r->length;
  std::
  vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
  ::emplace_back<int,int_const&>
            ((vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
              *)&this->m_payloads,(int *)(local_1e0 + 0x14),&r->length);
  peer_connection::setup_send(&this->super_peer_connection);
  this_01 = peer_connection::stats_counters(&this->super_peer_connection);
  counters::inc_stats_counter(this_01,0x5d,1);
  peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  paVar11 = torrent::alerts(peVar6);
  bVar2 = alert_manager::should_post<libtorrent::block_uploaded_alert>(paVar11);
  if (bVar2) {
    peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    paVar11 = torrent::alerts(peVar6);
    std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )local_30);
    torrent::get_handle((torrent *)local_1e0);
    iVar4 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x12])();
    iVar5 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xd])();
    iVar3 = r->start;
    peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    local_1e4 = torrent::block_size(peVar6);
    local_1e4 = iVar3 / local_1e4;
    alert_manager::
    emplace_alert<libtorrent::block_uploaded_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
              (paVar11,(torrent_handle *)local_1e0,
               (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar4),
               (digest32<160L> *)CONCAT44(extraout_var_00,iVar5),&local_1e4,&r->piece);
    torrent_handle::~torrent_handle((torrent_handle *)local_1e0);
  }
  std::shared_ptr<libtorrent::torrent>::~shared_ptr((shared_ptr<libtorrent::torrent> *)local_30);
  return;
}

Assistant:

void bt_peer_connection::write_piece(peer_request const& r, disk_buffer_holder buffer)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(m_sent_bitfield);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		bool merkle = t->torrent_file().is_merkle_torrent() && r.start == 0;
	// the hash piece looks like this:
	// uint8_t  msg
	// uint32_t piece index
	// uint32_t start
	// uint32_t list len
	// var      bencoded list
	// var      piece data
		char msg[4 + 1 + 4 + 4 + 4];
		char* ptr = msg;
		TORRENT_ASSERT(r.length <= 16 * 1024);
		detail::write_int32(r.length + 1 + 4 + 4, ptr);
		if (m_settings.get_bool(settings_pack::support_merkle_torrents) && merkle)
			detail::write_uint8(250, ptr);
		else
			detail::write_uint8(msg_piece, ptr);
		detail::write_int32(static_cast<int>(r.piece), ptr);
		detail::write_int32(r.start, ptr);

		// if this is a merkle torrent and the start offset
		// is 0, we need to include the merkle node hashes
		if (merkle)
		{
			std::vector<char> piece_list_buf;
			entry piece_list;
			entry::list_type& l = piece_list.list();
			std::map<int, sha1_hash> merkle_node_list = t->torrent_file().build_merkle_list(r.piece);
			l.reserve(merkle_node_list.size());
			for (auto const& i : merkle_node_list)
			{
				l.emplace_back(entry::list_t);
				l.back().list().emplace_back(i.first);
				l.back().list().emplace_back(i.second.to_string());
			}
			bencode(std::back_inserter(piece_list_buf), piece_list);
			detail::write_int32(int(piece_list_buf.size()), ptr);

			// back-patch the length field
			char* ptr2 = msg;
			detail::write_int32(r.length + 1 + 4 + 4 + 4 + int(piece_list_buf.size())
				, ptr2);

			send_buffer({msg, 17});
			send_buffer(piece_list_buf);
		}
		else
		{
			send_buffer({msg, 13});
		}

		if (buffer.is_mutable())
		{
			append_send_buffer(std::move(buffer), r.length);
		}
		else
		{
			append_const_send_buffer(std::move(buffer), r.length);
		}

		m_payloads.emplace_back(send_buffer_size() - r.length, r.length);
		setup_send();

		stats_counters().inc_stats_counter(counters::num_outgoing_piece);

		if (t->alerts().should_post<block_uploaded_alert>())
		{
			t->alerts().emplace_alert<block_uploaded_alert>(t->get_handle(),
				remote(), pid(), r.start / t->block_size() , r.piece);
		}
	}